

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O2

void pkey_rsa_cleanup(EVP_PKEY_CTX *ctx)

{
  void *orig_ptr;
  
  orig_ptr = ctx->data;
  if (orig_ptr != (void *)0x0) {
    BN_free(*(BIGNUM **)((long)orig_ptr + 8));
    OPENSSL_free(*(void **)((long)orig_ptr + 0x30));
    OPENSSL_free(*(void **)((long)orig_ptr + 0x38));
    OPENSSL_free(orig_ptr);
    return;
  }
  return;
}

Assistant:

static void pkey_rsa_cleanup(EVP_PKEY_CTX *ctx) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);

  if (rctx == NULL) {
    return;
  }

  BN_free(rctx->pub_exp);
  OPENSSL_free(rctx->tbuf);
  OPENSSL_free(rctx->oaep_label);
  OPENSSL_free(rctx);
}